

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::AbstractDOMParser::handleAttributesPSVI
          (AbstractDOMParser *this,XMLCh *localName,XMLCh *uri,PSVIAttributeList *psviAttributes)

{
  short *psVar1;
  short *psVar2;
  DOMDocumentImpl *pDVar3;
  PSVIHandler *pPVar4;
  byte bVar5;
  int iVar6;
  XMLSize_t XVar7;
  PSVIAttribute *pPVar8;
  undefined4 extraout_var;
  XMLCh *pXVar9;
  XMLCh *pXVar10;
  long *plVar11;
  undefined4 extraout_var_00;
  DOMTypeInfoImpl *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar12;
  DOMStringPoolEntry *pDVar13;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  long lVar14;
  undefined4 extraout_var_14;
  XMLCh XVar15;
  DOMDocument *pDVar16;
  DOMStringPoolEntry *pDVar17;
  XMLSize_t XVar18;
  undefined4 extraout_var_04;
  
  if ((this->fCreateSchemaInfo == true) &&
     (XVar7 = PSVIAttributeList::getLength(psviAttributes), XVar7 != 0)) {
    XVar7 = 0;
    do {
      pPVar8 = PSVIAttributeList::getAttributePSVIAtIndex(psviAttributes,XVar7);
      iVar6 = (*this->fCurrentNode->_vptr_DOMNode[0xb])();
      pXVar9 = PSVIAttributeList::getAttributeNamespaceAtIndex(psviAttributes,XVar7);
      pXVar10 = PSVIAttributeList::getAttributeNameAtIndex(psviAttributes,XVar7);
      plVar11 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x38))
                                  ((long *)CONCAT44(extraout_var,iVar6),pXVar9,pXVar10);
      if (plVar11 != (long *)0x0) {
        pDVar16 = &this->fDocument->super_DOMDocument;
        if (this->fDocument == (DOMDocumentImpl *)0x0) {
          pDVar16 = (DOMDocument *)0x0;
        }
        iVar6 = (*(pDVar16->super_DOMNode)._vptr_DOMNode[0x26])
                          (&pDVar16->super_DOMNode,&XMLUni::fgXercescInterfaceDOMMemoryManager,0);
        this_00 = (DOMTypeInfoImpl *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x20))
                            ((long *)CONCAT44(extraout_var_00,iVar6));
        DOMTypeInfoImpl::DOMTypeInfoImpl(this_00,(XMLCh *)0x0,(XMLCh *)0x0);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])
                  (this_00,0,(ulong)(pPVar8->super_PSVIItem).fValidityState);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])
                  (this_00,1,(ulong)(pPVar8->super_PSVIItem).fAssessmentType);
        iVar6 = (*(pPVar8->super_PSVIItem)._vptr_PSVIItem[2])(pPVar8);
        if (CONCAT44(extraout_var_01,iVar6) == 0) {
          if ((pPVar8->super_PSVIItem).fValidityState == VALIDITY_VALID) {
            (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,2,0x10);
            (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,5,0);
            (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])
                      (this_00,4,&SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
            (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])
                      (this_00,3,&SchemaSymbols::fgDT_ANYSIMPLETYPE);
          }
        }
        else {
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,2,0x10);
          iVar6 = (*(pPVar8->super_PSVIItem)._vptr_PSVIItem[2])(pPVar8);
          bVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0x38))
                            ((long *)CONCAT44(extraout_var_02,iVar6));
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,5,(ulong)bVar5);
          pDVar3 = this->fDocument;
          iVar6 = (*(pPVar8->super_PSVIItem)._vptr_PSVIItem[2])(pPVar8);
          pXVar9 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar6) + 0x18))
                                      ((long *)CONCAT44(extraout_var_03,iVar6));
          if (pXVar9 == (XMLCh *)0x0) {
            pXVar10 = (XMLCh *)0x0;
          }
          else {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)pXVar9 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 != 0);
            uVar12 = (ulong)(ushort)*pXVar9;
            if (uVar12 == 0) {
              uVar12 = 0;
            }
            else {
              XVar15 = pXVar9[1];
              if (XVar15 != L'\0') {
                pXVar10 = pXVar9 + 2;
                do {
                  uVar12 = (ulong)(ushort)XVar15 + (uVar12 >> 0x18) + uVar12 * 0x26;
                  XVar15 = *pXVar10;
                  pXVar10 = pXVar10 + 1;
                } while (XVar15 != L'\0');
              }
              uVar12 = uVar12 % pDVar3->fNameTableSize;
            }
            XVar18 = (lVar14 >> 1) - 1;
            pDVar13 = pDVar3->fNameTable[uVar12];
            if (pDVar13 == (DOMStringPoolEntry *)0x0) {
              pDVar17 = (DOMStringPoolEntry *)(pDVar3->fNameTable + uVar12);
            }
            else {
              do {
                pDVar17 = pDVar13;
                if (pDVar17->fLength == XVar18) {
                  pXVar10 = pDVar17->fString;
                  if (pXVar10 == pXVar9) goto LAB_002d5a61;
                  lVar14 = 0;
                  do {
                    psVar1 = (short *)((long)pXVar10 + lVar14);
                    if (*psVar1 == 0) {
                      if (*(short *)((long)pXVar9 + lVar14) == 0) goto LAB_002d5a61;
                      break;
                    }
                    psVar2 = (short *)((long)pXVar9 + lVar14);
                    lVar14 = lVar14 + 2;
                  } while (*psVar1 == *psVar2);
                }
                pDVar13 = pDVar17->fNext;
              } while (pDVar17->fNext != (DOMStringPoolEntry *)0x0);
            }
            iVar6 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                              (pDVar3,XVar18 * 2 + 0x18);
            pDVar13 = (DOMStringPoolEntry *)CONCAT44(extraout_var_04,iVar6);
            pDVar17->fNext = pDVar13;
            pDVar13->fLength = XVar18;
            pDVar13->fNext = (DOMStringPoolEntry *)0x0;
            pXVar10 = pDVar13->fString;
            XMLString::copyString(pXVar10,pXVar9);
          }
LAB_002d5a61:
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,4,pXVar10);
          pDVar3 = this->fDocument;
          iVar6 = (*(pPVar8->super_PSVIItem)._vptr_PSVIItem[2])(pPVar8);
          pXVar9 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar6) + 0x10))
                                      ((long *)CONCAT44(extraout_var_05,iVar6));
          if (pXVar9 == (XMLCh *)0x0) {
            pXVar10 = (XMLCh *)0x0;
          }
          else {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)pXVar9 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 != 0);
            uVar12 = (ulong)(ushort)*pXVar9;
            if (uVar12 == 0) {
              uVar12 = 0;
            }
            else {
              XVar15 = pXVar9[1];
              if (XVar15 != L'\0') {
                pXVar10 = pXVar9 + 2;
                do {
                  uVar12 = (ulong)(ushort)XVar15 + (uVar12 >> 0x18) + uVar12 * 0x26;
                  XVar15 = *pXVar10;
                  pXVar10 = pXVar10 + 1;
                } while (XVar15 != L'\0');
              }
              uVar12 = uVar12 % pDVar3->fNameTableSize;
            }
            XVar18 = (lVar14 >> 1) - 1;
            pDVar13 = pDVar3->fNameTable[uVar12];
            if (pDVar13 == (DOMStringPoolEntry *)0x0) {
              pDVar17 = (DOMStringPoolEntry *)(pDVar3->fNameTable + uVar12);
            }
            else {
              do {
                pDVar17 = pDVar13;
                if (pDVar17->fLength == XVar18) {
                  pXVar10 = pDVar17->fString;
                  if (pXVar10 == pXVar9) goto LAB_002d5b81;
                  lVar14 = 0;
                  do {
                    psVar1 = (short *)((long)pXVar10 + lVar14);
                    if (*psVar1 == 0) {
                      if (*(short *)((long)pXVar9 + lVar14) == 0) goto LAB_002d5b81;
                      break;
                    }
                    psVar2 = (short *)((long)pXVar9 + lVar14);
                    lVar14 = lVar14 + 2;
                  } while (*psVar1 == *psVar2);
                }
                pDVar13 = pDVar17->fNext;
              } while (pDVar17->fNext != (DOMStringPoolEntry *)0x0);
            }
            iVar6 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                              (pDVar3,XVar18 * 2 + 0x18);
            pDVar13 = (DOMStringPoolEntry *)CONCAT44(extraout_var_06,iVar6);
            pDVar17->fNext = pDVar13;
            pDVar13->fLength = XVar18;
            pDVar13->fNext = (DOMStringPoolEntry *)0x0;
            pXVar10 = pDVar13->fString;
            XMLString::copyString(pXVar10,pXVar9);
          }
LAB_002d5b81:
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,3,pXVar10);
        }
        iVar6 = (*(pPVar8->super_PSVIItem)._vptr_PSVIItem[3])(pPVar8);
        if (CONCAT44(extraout_var_07,iVar6) != 0) {
          iVar6 = (*(pPVar8->super_PSVIItem)._vptr_PSVIItem[3])(pPVar8);
          bVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar6) + 0x38))
                            ((long *)CONCAT44(extraout_var_08,iVar6));
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,9,(ulong)bVar5);
          pDVar3 = this->fDocument;
          iVar6 = (*(pPVar8->super_PSVIItem)._vptr_PSVIItem[3])(pPVar8);
          pXVar9 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_09,iVar6) + 0x18))
                                      ((long *)CONCAT44(extraout_var_09,iVar6));
          if (pXVar9 == (XMLCh *)0x0) {
            pXVar10 = (XMLCh *)0x0;
          }
          else {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)pXVar9 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 != 0);
            uVar12 = (ulong)(ushort)*pXVar9;
            if (uVar12 == 0) {
              uVar12 = 0;
            }
            else {
              XVar15 = pXVar9[1];
              if (XVar15 != L'\0') {
                pXVar10 = pXVar9 + 2;
                do {
                  uVar12 = (ulong)(ushort)XVar15 + (uVar12 >> 0x18) + uVar12 * 0x26;
                  XVar15 = *pXVar10;
                  pXVar10 = pXVar10 + 1;
                } while (XVar15 != L'\0');
              }
              uVar12 = uVar12 % pDVar3->fNameTableSize;
            }
            XVar18 = (lVar14 >> 1) - 1;
            pDVar13 = pDVar3->fNameTable[uVar12];
            if (pDVar13 == (DOMStringPoolEntry *)0x0) {
              pDVar17 = (DOMStringPoolEntry *)(pDVar3->fNameTable + uVar12);
            }
            else {
              do {
                pDVar17 = pDVar13;
                if (pDVar17->fLength == XVar18) {
                  pXVar10 = pDVar17->fString;
                  if (pXVar10 == pXVar9) goto LAB_002d5cd9;
                  lVar14 = 0;
                  do {
                    psVar1 = (short *)((long)pXVar10 + lVar14);
                    if (*psVar1 == 0) {
                      if (*(short *)((long)pXVar9 + lVar14) == 0) goto LAB_002d5cd9;
                      break;
                    }
                    psVar2 = (short *)((long)pXVar9 + lVar14);
                    lVar14 = lVar14 + 2;
                  } while (*psVar1 == *psVar2);
                }
                pDVar13 = pDVar17->fNext;
              } while (pDVar17->fNext != (DOMStringPoolEntry *)0x0);
            }
            iVar6 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                              (pDVar3,XVar18 * 2 + 0x18);
            pDVar13 = (DOMStringPoolEntry *)CONCAT44(extraout_var_10,iVar6);
            pDVar17->fNext = pDVar13;
            pDVar13->fLength = XVar18;
            pDVar13->fNext = (DOMStringPoolEntry *)0x0;
            pXVar10 = pDVar13->fString;
            XMLString::copyString(pXVar10,pXVar9);
          }
LAB_002d5cd9:
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,8,pXVar10);
          pDVar3 = this->fDocument;
          iVar6 = (*(pPVar8->super_PSVIItem)._vptr_PSVIItem[3])(pPVar8);
          pXVar9 = (XMLCh *)(**(code **)(*(long *)CONCAT44(extraout_var_11,iVar6) + 0x10))
                                      ((long *)CONCAT44(extraout_var_11,iVar6));
          if (pXVar9 == (XMLCh *)0x0) {
            pXVar10 = (XMLCh *)0x0;
          }
          else {
            lVar14 = 0;
            do {
              psVar1 = (short *)((long)pXVar9 + lVar14);
              lVar14 = lVar14 + 2;
            } while (*psVar1 != 0);
            uVar12 = (ulong)(ushort)*pXVar9;
            if (uVar12 == 0) {
              uVar12 = 0;
            }
            else {
              XVar15 = pXVar9[1];
              if (XVar15 != L'\0') {
                pXVar10 = pXVar9 + 2;
                do {
                  uVar12 = (ulong)(ushort)XVar15 + (uVar12 >> 0x18) + uVar12 * 0x26;
                  XVar15 = *pXVar10;
                  pXVar10 = pXVar10 + 1;
                } while (XVar15 != L'\0');
              }
              uVar12 = uVar12 % pDVar3->fNameTableSize;
            }
            XVar18 = (lVar14 >> 1) - 1;
            pDVar13 = pDVar3->fNameTable[uVar12];
            if (pDVar13 == (DOMStringPoolEntry *)0x0) {
              pDVar17 = (DOMStringPoolEntry *)(pDVar3->fNameTable + uVar12);
            }
            else {
              do {
                pDVar17 = pDVar13;
                if (pDVar17->fLength == XVar18) {
                  pXVar10 = pDVar17->fString;
                  if (pXVar10 == pXVar9) goto LAB_002d5df9;
                  lVar14 = 0;
                  do {
                    psVar1 = (short *)((long)pXVar10 + lVar14);
                    if (*psVar1 == 0) {
                      if (*(short *)((long)pXVar9 + lVar14) == 0) goto LAB_002d5df9;
                      break;
                    }
                    psVar2 = (short *)((long)pXVar9 + lVar14);
                    lVar14 = lVar14 + 2;
                  } while (*psVar1 == *psVar2);
                }
                pDVar13 = pDVar17->fNext;
              } while (pDVar17->fNext != (DOMStringPoolEntry *)0x0);
            }
            iVar6 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                              (pDVar3,XVar18 * 2 + 0x18);
            pDVar13 = (DOMStringPoolEntry *)CONCAT44(extraout_var_12,iVar6);
            pDVar17->fNext = pDVar13;
            pDVar13->fLength = XVar18;
            pDVar13->fNext = (DOMStringPoolEntry *)0x0;
            pXVar10 = pDVar13->fString;
            XMLString::copyString(pXVar10,pXVar9);
          }
LAB_002d5df9:
          (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,7,pXVar10);
        }
        pXVar9 = (pPVar8->super_PSVIItem).fDefaultValue;
        if (pXVar9 == (XMLCh *)0x0) {
          pXVar10 = (XMLCh *)0x0;
        }
        else {
          pDVar3 = this->fDocument;
          lVar14 = 0;
          do {
            psVar1 = (short *)((long)pXVar9 + lVar14);
            lVar14 = lVar14 + 2;
          } while (*psVar1 != 0);
          uVar12 = (ulong)(ushort)*pXVar9;
          if (uVar12 == 0) {
            uVar12 = 0;
          }
          else {
            XVar15 = pXVar9[1];
            if (XVar15 != L'\0') {
              pXVar10 = pXVar9 + 2;
              do {
                uVar12 = (ulong)(ushort)XVar15 + (uVar12 >> 0x18) + uVar12 * 0x26;
                XVar15 = *pXVar10;
                pXVar10 = pXVar10 + 1;
              } while (XVar15 != L'\0');
            }
            uVar12 = uVar12 % pDVar3->fNameTableSize;
          }
          XVar18 = (lVar14 >> 1) - 1;
          pDVar13 = pDVar3->fNameTable[uVar12];
          if (pDVar13 == (DOMStringPoolEntry *)0x0) {
            pDVar17 = (DOMStringPoolEntry *)(pDVar3->fNameTable + uVar12);
          }
          else {
            do {
              pDVar17 = pDVar13;
              if (pDVar17->fLength == XVar18) {
                pXVar10 = pDVar17->fString;
                if (pXVar10 == pXVar9) goto LAB_002d5f06;
                lVar14 = 0;
                do {
                  psVar1 = (short *)((long)pXVar10 + lVar14);
                  if (*psVar1 == 0) {
                    if (*(short *)((long)pXVar9 + lVar14) == 0) goto LAB_002d5f06;
                    break;
                  }
                  psVar2 = (short *)((long)pXVar9 + lVar14);
                  lVar14 = lVar14 + 2;
                } while (*psVar1 == *psVar2);
              }
              pDVar13 = pDVar17->fNext;
            } while (pDVar17->fNext != (DOMStringPoolEntry *)0x0);
          }
          iVar6 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                            (pDVar3,XVar18 * 2 + 0x18);
          pDVar13 = (DOMStringPoolEntry *)CONCAT44(extraout_var_13,iVar6);
          pDVar17->fNext = pDVar13;
          pDVar13->fLength = XVar18;
          pDVar13->fNext = (DOMStringPoolEntry *)0x0;
          pXVar10 = pDVar13->fString;
          XMLString::copyString(pXVar10,pXVar9);
        }
LAB_002d5f06:
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,10,pXVar10);
        pXVar9 = (pPVar8->super_PSVIItem).fNormalizedValue;
        if (pXVar9 == (XMLCh *)0x0) {
          pXVar10 = (XMLCh *)0x0;
        }
        else {
          pDVar3 = this->fDocument;
          lVar14 = 0;
          do {
            psVar1 = (short *)((long)pXVar9 + lVar14);
            lVar14 = lVar14 + 2;
          } while (*psVar1 != 0);
          uVar12 = (ulong)(ushort)*pXVar9;
          if (uVar12 == 0) {
            uVar12 = 0;
          }
          else {
            XVar15 = pXVar9[1];
            if (XVar15 != L'\0') {
              pXVar10 = pXVar9 + 2;
              do {
                uVar12 = (ulong)(ushort)XVar15 + (uVar12 >> 0x18) + uVar12 * 0x26;
                XVar15 = *pXVar10;
                pXVar10 = pXVar10 + 1;
              } while (XVar15 != L'\0');
            }
            uVar12 = uVar12 % pDVar3->fNameTableSize;
          }
          XVar18 = (lVar14 >> 1) - 1;
          pDVar13 = pDVar3->fNameTable[uVar12];
          if (pDVar13 == (DOMStringPoolEntry *)0x0) {
            pDVar17 = (DOMStringPoolEntry *)(pDVar3->fNameTable + uVar12);
          }
          else {
            do {
              pDVar17 = pDVar13;
              if (pDVar17->fLength == XVar18) {
                pXVar10 = pDVar17->fString;
                if (pXVar10 == pXVar9) goto LAB_002d6012;
                lVar14 = 0;
                do {
                  psVar1 = (short *)((long)pXVar10 + lVar14);
                  if (*psVar1 == 0) {
                    if (*(short *)((long)pXVar9 + lVar14) == 0) goto LAB_002d6012;
                    break;
                  }
                  psVar2 = (short *)((long)pXVar9 + lVar14);
                  lVar14 = lVar14 + 2;
                } while (*psVar1 == *psVar2);
              }
              pDVar13 = pDVar17->fNext;
            } while (pDVar17->fNext != (DOMStringPoolEntry *)0x0);
          }
          iVar6 = (*(pDVar3->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                            (pDVar3,XVar18 * 2 + 0x18);
          pDVar13 = (DOMStringPoolEntry *)CONCAT44(extraout_var_14,iVar6);
          pDVar17->fNext = pDVar13;
          pDVar13->fLength = XVar18;
          pDVar13->fNext = (DOMStringPoolEntry *)0x0;
          pXVar10 = pDVar13->fString;
          XMLString::copyString(pXVar10,pXVar9);
        }
LAB_002d6012:
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[7])(this_00,0xb,pXVar10);
        (*(this_00->super_DOMTypeInfo)._vptr_DOMTypeInfo[8])(this_00,0xc,1);
        (**(code **)(*plVar11 + 0x1a8))(plVar11,this_00);
      }
      XVar7 = XVar7 + 1;
      XVar18 = PSVIAttributeList::getLength(psviAttributes);
    } while (XVar7 < XVar18);
  }
  pPVar4 = this->fPSVIHandler;
  if (pPVar4 == (PSVIHandler *)0x0) {
    return;
  }
  (*pPVar4->_vptr_PSVIHandler[4])(pPVar4,localName,uri,psviAttributes);
  return;
}

Assistant:

void AbstractDOMParser::handleAttributesPSVI( const XMLCh* const            localName
                                            , const XMLCh* const            uri
                                            ,       PSVIAttributeList *     psviAttributes)
{
    if(fCreateSchemaInfo)
    {
        for (XMLSize_t index=0; index < psviAttributes->getLength(); index++) {
            xercesc::PSVIAttribute *attrInfo=psviAttributes->getAttributePSVIAtIndex(index);
            xercesc::DOMNode* pAttrNode=fCurrentNode->getAttributes()->getNamedItemNS(psviAttributes->getAttributeNamespaceAtIndex(index),
                                                                                                            psviAttributes->getAttributeNameAtIndex(index));
            if(pAttrNode!=NULL)
            {
                DOMTypeInfoImpl* typeInfo=new (getDocument()) DOMTypeInfoImpl();
                typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Validity, attrInfo->getValidity());
                typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Validation_Attempted, attrInfo->getValidationAttempted());
                if(attrInfo->getTypeDefinition())
                {
                    typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Type, XSTypeDefinition::SIMPLE_TYPE);
                    typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Anonymous, attrInfo->getTypeDefinition()->getAnonymous());
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Namespace,
                        fDocument->getPooledString(attrInfo->getTypeDefinition()->getNamespace()));
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Name,
                        fDocument->getPooledString(attrInfo->getTypeDefinition()->getName()));
                }
                else if(attrInfo->getValidity()==PSVIItem::VALIDITY_VALID)
                {
                    // if we are valid but we don't have a type validator, we are xs:anySimpleType
                    typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Type, XSTypeDefinition::SIMPLE_TYPE);
                    typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Anonymous, false);
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Namespace, SchemaSymbols::fgURI_SCHEMAFORSCHEMA);
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Type_Definition_Name, SchemaSymbols::fgDT_ANYSIMPLETYPE);
                }
                if(attrInfo->getMemberTypeDefinition())
                {
                    typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Anonymous, attrInfo->getMemberTypeDefinition()->getAnonymous());
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Namespace,
                        fDocument->getPooledString(attrInfo->getMemberTypeDefinition()->getNamespace()));
                    typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Member_Type_Definition_Name,
                        fDocument->getPooledString(attrInfo->getMemberTypeDefinition()->getName()));
                }
                typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Schema_Default, fDocument->getPooledString(attrInfo->getSchemaDefault()));
                typeInfo->setStringProperty(DOMPSVITypeInfo::PSVI_Schema_Normalized_Value, fDocument->getPooledString(attrInfo->getSchemaNormalizedValue()));
                typeInfo->setNumericProperty(DOMPSVITypeInfo::PSVI_Schema_Specified, true);
                ((DOMAttrImpl*)pAttrNode)->setSchemaTypeInfo(typeInfo);
            }
        }
    }
    // associate the info now; if the user wants, she can override what we did
    if(fPSVIHandler)
        fPSVIHandler->handleAttributesPSVI(localName, uri, psviAttributes);
}